

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

Expression __thiscall cnn::expr::hinge(expr *this,Expression *x,uint index,float m)

{
  ComputationGraph *arguments;
  undefined8 extraout_RDX;
  Expression EVar1;
  uint local_2c;
  float local_28;
  float local_24;
  uint *local_20;
  undefined8 local_18;
  
  arguments = x->pg;
  local_2c = (x->i).t;
  local_20 = &local_2c;
  local_18 = 1;
  local_28 = m;
  local_24 = (float)index;
  ComputationGraph::add_function<cnn::Hinge,unsigned_int&,float&>
            ((ComputationGraph *)(this + 8),(initializer_list<cnn::VariableIndex> *)arguments,
             (uint *)&local_20,&local_24);
  *(ComputationGraph **)this = arguments;
  EVar1._8_8_ = extraout_RDX;
  EVar1.pg = (ComputationGraph *)this;
  return EVar1;
}

Assistant:

Expression hinge(const Expression& x, unsigned index, float m) { return Expression(x.pg, x.pg->add_function<Hinge>({x.i}, index, m)); }